

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O1

int pt_evt_fetch_packet(pt_event_decoder *decoder)

{
  int iVar1;
  
  do {
    iVar1 = pt_pkt_next(&decoder->pacdec,&decoder->packet,0x18);
    if (iVar1 < 0) {
      (decoder->packet).type = ppt_invalid;
      (decoder->packet).size = '\0';
      decoder->status = iVar1;
      return iVar1;
    }
  } while ((decoder->packet).type == ppt_pad);
  return iVar1;
}

Assistant:

static int pt_evt_fetch_packet(struct pt_event_decoder *decoder)
{
	int status;

	if (!decoder)
		return -pte_internal;

	/* Skip PAD packets right here.
	 *
	 * This isn't strictly necessary but it gives more useful offsets.
	 */
	do {
		status = pt_pkt_next(&decoder->pacdec, &decoder->packet,
				     sizeof(decoder->packet));
		if (status < 0) {
			/* Store any error to be delivered later. */
			decoder->packet.type = ppt_invalid;
			decoder->packet.size = 0;
			decoder->status = status;

			break;
		}
	} while (decoder->packet.type == ppt_pad);

	return 0;
}